

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

UniValue *
RPCConvertValues(UniValue *__return_storage_ptr__,string *strMethod,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *strParams)

{
  long lVar1;
  UniValue val;
  pointer pbVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  string_view arg_value;
  undefined1 in_stack_ffffffffffffff48 [16];
  _Alloc_hider in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70 [48];
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar2 = (strParams->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((strParams->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    do {
      arg_value._M_str = pbVar2[uVar3]._M_dataplus._M_p;
      arg_value._M_len = pbVar2[uVar3]._M_string_length;
      CRPCConvertTable::ArgToUniValue
                ((UniValue *)&stack0xffffffffffffff50,&rpcCvtTable,arg_value,strMethod,(int)uVar3);
      val.val._M_string_length = (size_type)in_stack_ffffffffffffff58._M_p;
      val.typ = in_stack_ffffffffffffff48._0_4_;
      val._4_4_ = in_stack_ffffffffffffff48._4_4_;
      val.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff48._8_8_;
      val.val.field_2._M_allocated_capacity = in_stack_ffffffffffffff60;
      val.val.field_2._8_8_ = in_stack_ffffffffffffff68;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_ffffffffffffff70._0_24_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffff70._24_24_;
      UniValue::push_back(__return_storage_ptr__,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff78);
      if (in_stack_ffffffffffffff58._M_p != &stack0xffffffffffffff68) {
        operator_delete(in_stack_ffffffffffffff58._M_p,in_stack_ffffffffffffff68 + 1);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
      pbVar2 = (strParams->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(strParams->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5))
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue RPCConvertValues(const std::string &strMethod, const std::vector<std::string> &strParams)
{
    UniValue params(UniValue::VARR);

    for (unsigned int idx = 0; idx < strParams.size(); idx++) {
        std::string_view value{strParams[idx]};
        params.push_back(rpcCvtTable.ArgToUniValue(value, strMethod, idx));
    }

    return params;
}